

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OoutReportText.cpp
# Opt level: O2

void __thiscall
oout::OoutReportText::OoutReportText(OoutReportText *this,shared_ptr<const_oout::Result> *result)

{
  (this->super_Text)._vptr_Text = (_func_int **)&PTR__OoutReportText_001cdb00;
  std::__shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->result).super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>,
             &result->super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

OoutReportText::OoutReportText(const shared_ptr<const Result> &result)
	: result(result)
{
}